

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NamedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,PropertyExprSyntax **args_4,Token *args_5)

{
  Token dot;
  Token name;
  Token openParen;
  Token closeParen;
  NamedPortConnectionSyntax *this_00;
  PropertyExprSyntax **args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (NamedPortConnectionSyntax *)allocate(this,0x88,8);
  dot.kind = args_1->kind;
  dot._2_1_ = args_1->field_0x2;
  dot.numFlags.raw = (args_1->numFlags).raw;
  dot.rawLen = args_1->rawLen;
  dot.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  openParen.kind = args_3->kind;
  openParen._2_1_ = args_3->field_0x2;
  openParen.numFlags.raw = (args_3->numFlags).raw;
  openParen.rawLen = args_3->rawLen;
  openParen.info = args_3->info;
  closeParen.kind = args_5->kind;
  closeParen._2_1_ = args_5->field_0x2;
  closeParen.numFlags.raw = (args_5->numFlags).raw;
  closeParen.rawLen = args_5->rawLen;
  closeParen.info = args_5->info;
  slang::syntax::NamedPortConnectionSyntax::NamedPortConnectionSyntax
            (this_00,args,dot,name,openParen,*args_4,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }